

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O3

bool __thiscall Algorithms::isPrime_MillerRabin(Algorithms *this,BigInteger *n,int k)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  BigInteger a;
  BigInteger m;
  BigInteger x;
  BigInteger local_120;
  BigInteger local_100;
  uint local_e0;
  int local_dc;
  BigInteger local_d8;
  BigInteger local_b8;
  BigInteger local_98;
  ulong local_78;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::operator%(&local_d8,n,2);
  BigIntegerLibrary::BigInteger::BigInteger(&local_100,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_d8,&local_100);
  if (local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BigIntegerLibrary::BigInteger::operator-(&local_d8,n,1);
    uVar6 = 0xffffffff;
    while( true ) {
      BigIntegerLibrary::BigInteger::operator%(&local_100,&local_d8,2);
      BigIntegerLibrary::BigInteger::BigInteger(&local_b8,0);
      bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_100,&local_b8);
      if (local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar1) break;
      uVar6 = (ulong)((int)uVar6 + 1);
      BigIntegerLibrary::BigInteger::operator/=(&local_d8,2);
    }
    if (k < 1) {
      bVar1 = true;
    }
    else {
      local_e0 = (int)uVar6 + 1;
      bVar1 = false;
      iVar4 = 0;
      local_78 = uVar6;
      do {
        local_dc = iVar4;
        BigIntegerLibrary::BigInteger::BigInteger(&local_70,2);
        BigIntegerLibrary::BigInteger::operator-(&local_50,n,2);
        random((Algorithms *)&local_100);
        if (local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        BigIntegerLibrary::powm(&local_b8,&local_100,&local_d8,n);
        BigIntegerLibrary::BigInteger::BigInteger(&local_120,1);
        bVar2 = BigIntegerLibrary::BigInteger::operator==(&local_b8,&local_120);
        bVar3 = true;
        if (!bVar2) {
          BigIntegerLibrary::BigInteger::operator-(&local_98,n,1);
          bVar3 = BigIntegerLibrary::BigInteger::operator==(&local_b8,&local_98);
          if (local_98.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
        }
        if (local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar6 = local_78 & 0xffffffff;
        if (local_e0 < 2 || bVar3 != false) {
          cVar7 = bVar3 * '\x05' + '\x01';
        }
        else {
          do {
            BigIntegerLibrary::BigInteger::operator*(&local_98,&local_b8,&local_b8);
            BigIntegerLibrary::BigInteger::operator%(&local_120,&local_98,n);
            BigIntegerLibrary::BigInteger::operator=(&local_b8,&local_120);
            if (local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_98.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_98.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_98.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_98.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            BigIntegerLibrary::BigInteger::BigInteger(&local_120,1);
            bVar2 = BigIntegerLibrary::BigInteger::operator==(&local_b8,&local_120);
            if (local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            cVar7 = '\x01';
            if (bVar2) break;
            BigIntegerLibrary::BigInteger::operator-(&local_120,n,1);
            bVar2 = BigIntegerLibrary::BigInteger::operator==(&local_b8,&local_120);
            if (local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_120.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_120.num.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (bVar2) {
              cVar7 = '\0';
              break;
            }
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
          } while (uVar5 != 0);
        }
        if (local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_100.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((cVar7 != '\x06') && (cVar7 != '\0')) break;
        iVar4 = local_dc + 1;
        bVar1 = k <= iVar4;
      } while (iVar4 != k);
    }
    if (local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool Algorithms::isPrime_MillerRabin(const BigInteger &n, int k) {
    if (n % 2 == 0) {
        return false;
    }
    BigInteger m = (n - 1);
    int s = 0;
    while (m % 2 == 0) {
        ++s;
        m /= 2;
    }
    for (int i = 0; i < k; ++i) {
        BigInteger a = random(2, n - 2);
        BigInteger x = powm(a, m, n);
        if (x == 1 || x == n - 1) {
            continue;
        }
        bool flag = false;
        for (int j = 0; j < s - 1; ++j) {
            x = x * x % n;
            if (x == 1) {
                return false;
            }
            if (x == n - 1) {
                flag = true;
                break;
            }
        }
        if (!flag) {
            return false;
        }
    }
    return true;
}